

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

pool_ptr<soul::AST::Namespace> __thiscall
soul::StructuralParser::parseNamespaceDecl
          (StructuralParser *this,CodeLocation *keywordLocation,ModuleBase *ns)

{
  SourceCodeText *local_18;
  undefined8 local_10;
  
  local_18 = (SourceCodeText *)(ns->super_ASTObject)._vptr_ASTObject;
  if (local_18 != (SourceCodeText *)0x0) {
    (local_18->super_RefCountedObject).refCount = (local_18->super_RefCountedObject).refCount + 1;
  }
  local_10._0_4_ = (ns->super_ASTObject).objectType;
  local_10._4_4_ = *(undefined4 *)&(ns->super_ASTObject).field_0xc;
  parseTopLevelItem<soul::AST::Namespace>
            (this,keywordLocation,(ModuleBase *)&stack0xffffffffffffffe8);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18);
  return (pool_ptr<soul::AST::Namespace>)(Namespace *)this;
}

Assistant:

pool_ptr<AST::Namespace> parseNamespaceDecl (CodeLocation keywordLocation, AST::ModuleBase& ns)   { return parseTopLevelItem<AST::Namespace> (keywordLocation, ns); }